

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStatsdClient.cpp
# Opt level: O2

void testSendRecv(uint64_t batchSize,uint64_t sendInterval)

{
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *message;
  long lVar4;
  pointer pbVar5;
  int iVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  allocator local_14ed;
  allocator local_14ec;
  allocator local_14eb;
  allocator local_14ea;
  allocator_type local_14e9;
  string local_14e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_14b0;
  thread server;
  string local_1488;
  string local_1468 [32];
  string local_1448 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  StatsdServer mock_server;
  StatsdClient client;
  
  Statsd::StatsdServer::StatsdServer(&mock_server,0x1fbd);
  local_1488._M_dataplus._M_p = (pointer)&messages;
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  client.m_prefix._M_dataplus._M_p = (pointer)&mock_server;
  std::thread::
  thread<void(&)(Statsd::StatsdServer&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&),std::reference_wrapper<Statsd::StatsdServer>,std::reference_wrapper<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            (&server,mock,(reference_wrapper<Statsd::StatsdServer> *)&client,
             (reference_wrapper<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_1488);
  std::__cxx11::string::string((string *)&local_1488,"localhost",(allocator *)&local_14b0);
  std::__cxx11::string::string((string *)&local_14e8,"sendRecv.",&local_14ed);
  Statsd::StatsdClient::StatsdClient
            (&client,&local_1488,0x1fbd,&local_14e8,batchSize,sendInterval,3);
  std::__cxx11::string::~string((string *)&local_14e8);
  std::__cxx11::string::~string((string *)&local_1488);
  std::__cxx11::string::string((string *)&local_1488,"",(allocator *)&local_14e8);
  throwOnError<Statsd::StatsdClient>(&client,true,&local_1488);
  std::__cxx11::string::~string((string *)&local_1488);
  for (iVar6 = 0; iVar6 != 3; iVar6 = iVar6 + 1) {
    std::__cxx11::string::string((string *)&local_1488,"coco",(allocator *)&local_14b0);
    local_14e8._M_dataplus._M_p = (pointer)0x0;
    local_14e8._M_string_length = 0;
    local_14e8.field_2._M_allocated_capacity = 0;
    Statsd::StatsdClient::increment
              (&client,&local_1488,1.0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_14e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_14e8);
    std::__cxx11::string::~string((string *)&local_1488);
    std::__cxx11::string::string((string *)&local_1488,"",(allocator *)&local_14e8);
    throwOnError<Statsd::StatsdClient>(&client,true,&local_1488);
    std::__cxx11::string::~string((string *)&local_1488);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[18]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&expected,
               (char (*) [18])"sendRecv.coco:1|c");
    std::__cxx11::string::string((string *)&local_1488,"kiki",(allocator *)&local_14b0);
    local_14e8._M_dataplus._M_p = (pointer)0x0;
    local_14e8._M_string_length = 0;
    local_14e8.field_2._M_allocated_capacity = 0;
    Statsd::StatsdClient::decrement
              (&client,&local_1488,1.0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_14e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_14e8);
    std::__cxx11::string::~string((string *)&local_1488);
    std::__cxx11::string::string((string *)&local_1488,"",(allocator *)&local_14e8);
    throwOnError<Statsd::StatsdClient>(&client,true,&local_1488);
    std::__cxx11::string::~string((string *)&local_1488);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[19]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&expected,
               (char (*) [19])"sendRecv.kiki:-1|c");
    Statsd::StatsdClient::seed(&client,0x13);
    std::__cxx11::string::string((string *)&local_1488,"toto",(allocator *)&local_14b0);
    local_14e8._M_dataplus._M_p = (pointer)0x0;
    local_14e8._M_string_length = 0;
    local_14e8.field_2._M_allocated_capacity = 0;
    Statsd::StatsdClient::count
              (&client,&local_1488,2,0.1,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_14e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_14e8);
    std::__cxx11::string::~string((string *)&local_1488);
    std::__cxx11::string::string((string *)&local_1488,"",(allocator *)&local_14e8);
    throwOnError<Statsd::StatsdClient>(&client,true,&local_1488);
    std::__cxx11::string::~string((string *)&local_1488);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[24]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&expected,
               (char (*) [24])"sendRecv.toto:2|c|@0.10");
    std::__cxx11::string::string((string *)&local_1488,"popo",(allocator *)&local_14b0);
    local_14e8._M_dataplus._M_p = (pointer)0x0;
    local_14e8._M_string_length = 0;
    local_14e8.field_2._M_allocated_capacity = 0;
    Statsd::StatsdClient::count
              (&client,&local_1488,9,0.1,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_14e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_14e8);
    std::__cxx11::string::~string((string *)&local_1488);
    std::__cxx11::string::string((string *)&local_1488,"",(allocator *)&local_14e8);
    throwOnError<Statsd::StatsdClient>(&client,true,&local_1488);
    std::__cxx11::string::~string((string *)&local_1488);
    std::__cxx11::string::string((string *)&local_1488,"titi",(allocator *)&local_14b0);
    local_14e8._M_dataplus._M_p = (pointer)0x0;
    local_14e8._M_string_length = 0;
    local_14e8.field_2._M_allocated_capacity = 0;
    Statsd::StatsdClient::gauge<int>
              (&client,&local_1488,3,1.0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_14e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_14e8);
    std::__cxx11::string::~string((string *)&local_1488);
    std::__cxx11::string::string((string *)&local_1488,"",(allocator *)&local_14e8);
    throwOnError<Statsd::StatsdClient>(&client,true,&local_1488);
    std::__cxx11::string::~string((string *)&local_1488);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[18]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&expected,
               (char (*) [18])"sendRecv.titi:3|g");
    std::__cxx11::string::string((string *)&local_1488,"titifloat",(allocator *)&local_14b0);
    local_14e8._M_dataplus._M_p = (pointer)0x0;
    local_14e8._M_string_length = 0;
    local_14e8.field_2._M_allocated_capacity = 0;
    Statsd::StatsdClient::gauge<double>
              (&client,&local_1488,-123.456789,1.0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_14e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_14e8);
    std::__cxx11::string::~string((string *)&local_1488);
    std::__cxx11::string::string((string *)&local_1488,"",(allocator *)&local_14e8);
    throwOnError<Statsd::StatsdClient>(&client,true,&local_1488);
    std::__cxx11::string::~string((string *)&local_1488);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[30]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&expected,
               (char (*) [30])"sendRecv.titifloat:-123.457|g");
    Statsd::StatsdClient::seed(&client,0x13);
    std::__cxx11::string::string((string *)&local_1488,"myTiming",(allocator *)&local_14b0);
    local_14e8._M_dataplus._M_p = (pointer)0x0;
    local_14e8._M_string_length = 0;
    local_14e8.field_2._M_allocated_capacity = 0;
    Statsd::StatsdClient::timing
              (&client,&local_1488,2,0.1,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_14e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_14e8);
    std::__cxx11::string::~string((string *)&local_1488);
    std::__cxx11::string::string((string *)&local_1488,"",(allocator *)&local_14e8);
    throwOnError<Statsd::StatsdClient>(&client,true,&local_1488);
    std::__cxx11::string::~string((string *)&local_1488);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[29]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&expected,
               (char (*) [29])"sendRecv.myTiming:2|ms|@0.10");
    std::__cxx11::string::string((string *)&local_1488,"tutu",(allocator *)&local_14b0);
    local_14e8._M_dataplus._M_p = (pointer)0x0;
    local_14e8._M_string_length = 0;
    local_14e8.field_2._M_allocated_capacity = 0;
    Statsd::StatsdClient::set
              (&client,&local_1488,0x4cb,2.0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_14e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_14e8);
    std::__cxx11::string::~string((string *)&local_1488);
    std::__cxx11::string::string((string *)&local_1488,"",(allocator *)&local_14e8);
    throwOnError<Statsd::StatsdClient>(&client,true,&local_1488);
    std::__cxx11::string::~string((string *)&local_1488);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[21]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&expected,
               (char (*) [21])"sendRecv.tutu:1227|s");
    std::__cxx11::string::string((string *)&local_14e8,anon_var_dwarf_916c,&local_14ed);
    std::__cxx11::string::string((string *)&local_1488,"liegt",&local_14ea);
    std::__cxx11::string::string(local_1468,"im",&local_14eb);
    std::__cxx11::string::string(local_1448,anon_var_dwarf_91b4 + 0x28,&local_14ec);
    __l._M_len = 3;
    __l._M_array = &local_1488;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_14b0,__l,&local_14e9);
    Statsd::StatsdClient::gauge<int>(&client,&local_14e8,0x14d,1.0,&local_14b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_14b0);
    lVar4 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&local_1488._M_dataplus._M_p + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    std::__cxx11::string::~string((string *)&local_14e8);
    std::__cxx11::string::string((string *)&local_1488,"",(allocator *)&local_14e8);
    throwOnError<Statsd::StatsdClient>(&client,true,&local_1488);
    std::__cxx11::string::~string((string *)&local_1488);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[46]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&expected,
               &anon_var_dwarf_91b4);
    std::__cxx11::string::string((string *)&local_14e8,"foo",&local_14ed);
    std::__cxx11::string::string((string *)&local_1488,"bar",&local_14ea);
    std::__cxx11::string::string(local_1468,"baz",&local_14eb);
    __l_00._M_len = 2;
    __l_00._M_array = &local_1488;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_14b0,__l_00,(allocator_type *)&local_14ec);
    Statsd::StatsdClient::count(&client,&local_14e8,-0x2a,0.9,&local_14b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_14b0);
    lVar4 = 0x20;
    do {
      std::__cxx11::string::~string((string *)((long)&local_1488._M_dataplus._M_p + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    std::__cxx11::string::~string((string *)&local_14e8);
    std::__cxx11::string::string((string *)&local_1488,"",(allocator *)&local_14e8);
    throwOnError<Statsd::StatsdClient>(&client,true,&local_1488);
    std::__cxx11::string::~string((string *)&local_1488);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[34]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&expected,
               (char (*) [34])"sendRecv.foo:-42|c|@0.90|#bar,baz");
    std::__cxx11::string::string((string *)&local_14e8,"custom_metric_type",&local_14ed);
    std::__cxx11::string::string((string *)&local_1488,"tag1",&local_14ea);
    std::__cxx11::string::string(local_1468,"tag2",&local_14eb);
    __l_01._M_len = 2;
    __l_01._M_array = &local_1488;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_14b0,__l_01,(allocator_type *)&local_14ec);
    Statsd::StatsdClient::send<int>(&client,&local_14e8,0x162e,"cust",0.95,&local_14b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_14b0);
    lVar4 = 0x20;
    do {
      std::__cxx11::string::~string((string *)((long)&local_1488._M_dataplus._M_p + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    std::__cxx11::string::~string((string *)&local_14e8);
    std::__cxx11::string::string((string *)&local_1488,"",(allocator *)&local_14e8);
    throwOnError<Statsd::StatsdClient>(&client,true,&local_1488);
    std::__cxx11::string::~string((string *)&local_1488);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[55]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&expected,
               (char (*) [55])"sendRecv.custom_metric_type:5678|cust|@0.95|#tag1,tag2");
  }
  std::__cxx11::string::string((string *)&local_1488,"DONE",(allocator *)&local_14b0);
  local_14e8._M_dataplus._M_p = (pointer)0x0;
  local_14e8._M_string_length = 0;
  local_14e8.field_2._M_allocated_capacity = 0;
  Statsd::StatsdClient::timing
            (&client,&local_1488,0,1.0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_14e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_14e8);
  std::__cxx11::string::~string((string *)&local_1488);
  if (sendInterval == 0) {
    Statsd::UDPSender::flush
              ((UDPSender *)
               client.m_sender._M_t.
               super___uniq_ptr_impl<Statsd::UDPSender,_std::default_delete<Statsd::UDPSender>_>.
               _M_t.
               super__Tuple_impl<0UL,_Statsd::UDPSender_*,_std::default_delete<Statsd::UDPSender>_>.
               super__Head_base<0UL,_Statsd::UDPSender_*,_false>._M_head_impl);
  }
  std::thread::join();
  bVar2 = std::operator!=(&messages,&expected);
  if (!bVar2) {
    Statsd::StatsdClient::~StatsdClient(&client);
    std::thread::~thread(&server);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&expected);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&messages);
    Statsd::StatsdServer::~StatsdServer(&mock_server);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Unexpected stats received by server, got:");
  std::endl<char,std::char_traits<char>>(poVar3);
  pbVar1 = messages.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = messages.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)pbVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  poVar3 = std::operator<<(poVar3,"But we expected:");
  std::endl<char,std::char_traits<char>>(poVar3);
  pbVar1 = expected.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = expected.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)pbVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Unexpected stats");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void testSendRecv(uint64_t batchSize, uint64_t sendInterval) {
    StatsdServer mock_server;
    std::vector<std::string> messages, expected;
    std::thread server(mock, std::ref(mock_server), std::ref(messages));

    // Set a new config that has the client send messages to a proper address that can be resolved
    StatsdClient client("localhost", 8125, "sendRecv.", batchSize, sendInterval, 3);
    throwOnError(client);

    // TODO: I forget if we need to wait for the server to be ready here before sending the first stats
    //  is there a race condition where the client sending before the server binds would drop that clients message

    for (int i = 0; i < 3; ++i) {
        // Increment "coco"
        client.increment("coco");
        throwOnError(client);
        expected.emplace_back("sendRecv.coco:1|c");

        // Decrement "kiki"
        client.decrement("kiki");
        throwOnError(client);
        expected.emplace_back("sendRecv.kiki:-1|c");

        // Adjusts "toto" by +2
        client.seed(19);  // this seed gets a hit on the first call
        client.count("toto", 2, 0.1f);
        throwOnError(client);
        expected.emplace_back("sendRecv.toto:2|c|@0.10");

        // Gets "sampled out" by the random number generator
        client.count("popo", 9, 0.1f);
        throwOnError(client);

        // Record a gauge "titi" to 3
        client.gauge("titi", 3);
        throwOnError(client);
        expected.emplace_back("sendRecv.titi:3|g");

        // Record a gauge "titifloat" to -123.456789 with precision 3
        client.gauge("titifloat", -123.456789);
        throwOnError(client);
        expected.emplace_back("sendRecv.titifloat:-123.457|g");

        // Record a timing of 2ms for "myTiming"
        client.seed(19);
        client.timing("myTiming", 2, 0.1f);
        throwOnError(client);
        expected.emplace_back("sendRecv.myTiming:2|ms|@0.10");

        // Send a set with 1227 total uniques
        client.set("tutu", 1227, 2.0f);
        throwOnError(client);
        expected.emplace_back("sendRecv.tutu:1227|s");

        // Gauge but with tags
        client.gauge("dr.röstigrabe", 333, 1.f, {"liegt", "im", "weste"});
        throwOnError(client);
        expected.emplace_back("sendRecv.dr.röstigrabe:333|g|#liegt,im,weste");

        // All the things
        client.count("foo", -42, .9f, {"bar", "baz"});
        throwOnError(client);
        expected.emplace_back("sendRecv.foo:-42|c|@0.90|#bar,baz");

        // Custom metric type should pass through all params
        client.custom("custom_metric_type", 5678, "cust", .95f, {"tag1", "tag2"});
        throwOnError(client);
        expected.emplace_back("sendRecv.custom_metric_type:5678|cust|@0.95|#tag1,tag2");
    }

    // Signal the mock server we are done
    client.timing("DONE", 0);

    // If manual flushing do it now
    if (sendInterval == 0) {
        client.flush();
    }

    // Wait for the server to stop
    server.join();

    // Make sure we get the exactly correct output
    if (messages != expected) {
        std::cerr << "Unexpected stats received by server, got:" << std::endl;
        for (const auto& message : messages) {
            std::cerr << message << std::endl;
        }
        std::cerr << std::endl << "But we expected:" << std::endl;
        for (const auto& message : expected) {
            std::cerr << message << std::endl;
        }
        throw std::runtime_error("Unexpected stats");
    }
}